

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::VertexArrayTest::VertexArrayTest
          (VertexArrayTest *this,TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc
          )

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  float fVar2;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__VertexArrayTest_021cdbc8;
  this->m_renderCtx = renderCtx;
  this->m_refBuffers = (ReferenceContextBuffers *)0x0;
  this->m_refContext = (ReferenceContext *)0x0;
  this->m_glesContext = (Context *)0x0;
  this->m_glArrayPack = (ContextArrayPack *)0x0;
  *(undefined8 *)((long)&this->m_glArrayPack + 1) = 0;
  *(undefined8 *)((long)&this->m_rrArrayPack + 1) = 0;
  iVar1 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  fVar2 = ceilf((2.0 / (float)(1 << (*(byte *)(CONCAT44(extraout_var,iVar1) + 8) & 0x1f))) * 256.0);
  this->m_maxDiffRed = (int)fVar2;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  fVar2 = ceilf((2.0 / (float)(1 << (*(byte *)(CONCAT44(extraout_var_00,iVar1) + 0xc) & 0x1f))) *
                256.0);
  this->m_maxDiffGreen = (int)fVar2;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  fVar2 = ceilf((2.0 / (float)(1 << (*(byte *)(CONCAT44(extraout_var_01,iVar1) + 0x10) & 0x1f))) *
                256.0);
  this->m_maxDiffBlue = (int)fVar2;
  return;
}

Assistant:

VertexArrayTest::VertexArrayTest (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name ,const char* desc)
	: TestCase			(testCtx, name, desc)
	, m_renderCtx		(renderCtx)
	, m_refBuffers		(DE_NULL)
	, m_refContext		(DE_NULL)
	, m_glesContext		(DE_NULL)
	, m_glArrayPack		(DE_NULL)
	, m_rrArrayPack		(DE_NULL)
	, m_isOk			(false)
	, m_maxDiffRed		(deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().redBits))))
	, m_maxDiffGreen	(deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().greenBits))))
	, m_maxDiffBlue		(deCeilFloatToInt32(256.0f * (2.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().blueBits))))
{
}